

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_unary.h
# Opt level: O3

vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
* __thiscall
lf::mesh::utils::internal::UnaryOpMinus::operator()
          (vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
           *__return_storage_ptr__,UnaryOpMinus *this,
          vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
          *u,int param_2)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  uint uVar6;
  undefined4 uVar7;
  uint uVar8;
  vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  *pvVar9;
  pointer pAVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ActualDstType actualDst;
  Array<double,__1,_1,_0,__1,_1> *dst;
  vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  result;
  assign_op<double,_double> local_61;
  vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  *local_60;
  CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>
  local_58;
  vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  local_48;
  
  local_60 = __return_storage_ptr__;
  std::
  vector<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector(&local_48,
           (long)(u->
                 super__Vector_base<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(u->
                 super__Vector_base<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_58);
  pAVar10 = (u->
            super__Vector_base<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((u->
      super__Vector_base<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pAVar10) {
    uVar12 = 0;
    do {
      local_58.m_xpr = pAVar10 + uVar12;
      dst = local_48.
            super__Vector_base<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start + uVar12;
      pdVar3 = pAVar10[uVar12].super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      Eigen::internal::
      resize_if_allowed<Eigen::Array<double,_1,1,0,_1,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>,double,double>
                (dst,&local_58,&local_61);
      pdVar4 = (dst->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar5 = (dst->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      uVar11 = uVar5 - ((long)uVar5 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar5) {
        lVar13 = 0;
        do {
          pdVar1 = pdVar3 + lVar13;
          uVar6 = *(uint *)((long)pdVar1 + 4);
          uVar7 = *(undefined4 *)(pdVar1 + 1);
          uVar8 = *(uint *)((long)pdVar1 + 0xc);
          pdVar2 = pdVar4 + lVar13;
          *(undefined4 *)pdVar2 = *(undefined4 *)pdVar1;
          *(uint *)((long)pdVar2 + 4) = uVar6 ^ 0x80000000;
          *(undefined4 *)(pdVar2 + 1) = uVar7;
          *(uint *)((long)pdVar2 + 0xc) = uVar8 ^ 0x80000000;
          lVar13 = lVar13 + 2;
        } while (lVar13 < (long)uVar11);
      }
      if ((long)uVar11 < (long)uVar5) {
        do {
          pdVar4[uVar11] = -pdVar3[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar5 != uVar11);
      }
      uVar12 = uVar12 + 1;
      pAVar10 = (u->
                super__Vector_base<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)(u->
                                    super__Vector_base<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar10 >> 4
                             ));
  }
  pvVar9 = local_60;
  (local_60->
  super__Vector_base<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (local_60->
  super__Vector_base<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (local_60->
  super__Vector_base<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_48);
  return pvVar9;
}

Assistant:

auto operator()(const std::vector<Eigen::Array<S, R, C, O, MR, MC>>& u,
                  int /*unused*/) const {
    if constexpr (R == 0 || C == 0) {
      // result array is empty
      return u;
    }
    if constexpr (R != Eigen::Dynamic && C != Eigen::Dynamic) {
      // array size is known at compile time
      Eigen::Map<const Eigen::Array<S, 1, Eigen::Dynamic>> um(&u[0](0, 0), 1,
                                                              u.size() * R * C);
      std::vector<Eigen::Array<S, R, C, O, MR, MC>> result(u.size());
      Eigen::Map<Eigen::Array<S, 1, Eigen::Dynamic>> rm(&result[0](0, 0), 1,
                                                        u.size() * R * C);
      rm = -um;
      return result;
    } else {
      // array size is dynamic
      std::vector<Eigen::Array<S, R, C, O, MR, MC>> result(u.size());
      for (int i = 0; i < u.size(); ++i) {
        result[i] = -u[i];
      }
      return result;
    }
  }